

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall
wallet::WalletBatch::WriteCryptedKey
          (WalletBatch *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret,
          CKeyMetadata *keyMeta)

{
  uchar *data;
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  ulong uVar4;
  size_t __n;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  uint256 checksum;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey> key
  ;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  local_130;
  undefined8 local_c8;
  uchar auStack_c0 [24];
  _Alloc_hider local_a8;
  size_type sStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  uchar local_88 [80];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = WriteKeyMetadata(this,keyMeta,vchPubKey,true);
  if (bVar1) {
    auStack_c0[8] = '\0';
    auStack_c0[9] = '\0';
    auStack_c0[10] = '\0';
    auStack_c0[0xb] = '\0';
    auStack_c0[0xc] = '\0';
    auStack_c0[0xd] = '\0';
    auStack_c0[0xe] = '\0';
    auStack_c0[0xf] = '\0';
    auStack_c0[0x10] = '\0';
    auStack_c0[0x11] = '\0';
    auStack_c0[0x12] = '\0';
    auStack_c0[0x13] = '\0';
    auStack_c0[0x14] = '\0';
    auStack_c0[0x15] = '\0';
    auStack_c0[0x16] = '\0';
    auStack_c0[0x17] = '\0';
    local_c8 = 0;
    auStack_c0[0] = '\0';
    auStack_c0[1] = '\0';
    auStack_c0[2] = '\0';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    local_88[0x30] = '\0';
    local_88[0x31] = '\0';
    local_88[0x32] = '\0';
    local_88[0x33] = '\0';
    local_88[0x34] = '\0';
    local_88[0x35] = '\0';
    local_88[0x36] = '\0';
    local_88[0x37] = '\0';
    local_88[0x38] = '\0';
    local_88[0x39] = '\0';
    local_88[0x3a] = '\0';
    local_88[0x3b] = '\0';
    local_88[0x3c] = '\0';
    local_88[0x3d] = '\0';
    local_88[0x3e] = '\0';
    local_88[0x3f] = '\0';
    local_88[0x20] = '\0';
    local_88[0x21] = '\0';
    local_88[0x22] = '\0';
    local_88[0x23] = '\0';
    local_88[0x24] = '\0';
    local_88[0x25] = '\0';
    local_88[0x26] = '\0';
    local_88[0x27] = '\0';
    local_88[0x28] = '\0';
    local_88[0x29] = '\0';
    local_88[0x2a] = '\0';
    local_88[0x2b] = '\0';
    local_88[0x2c] = '\0';
    local_88[0x2d] = '\0';
    local_88[0x2e] = '\0';
    local_88[0x2f] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_98._M_allocated_capacity = 0;
    local_98._8_4_ = 0;
    local_98._12_4_ = 0;
    local_a8._M_p = (pointer)0x0;
    sStack_a0 = 0;
    local_88[0x40] = '\0';
    local_88[0x41] = '\0';
    local_88[0x42] = '\0';
    local_88[0x43] = '\0';
    local_88[0x44] = '\0';
    local_88[0x45] = '\0';
    local_88[0x46] = '\0';
    local_88[0x47] = '\0';
    CSHA256::CSHA256((CSHA256 *)&local_a8);
    data = (vchCryptedSecret->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
    CSHA256::Write((CSHA256 *)&local_a8,data,
                   (long)(vchCryptedSecret->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)data);
    output.m_size = 0x20;
    output.m_data = (uchar *)&local_c8;
    CHash256::Finalize((CHash256 *)&local_a8,output);
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,DBKeys::CRYPTED_KEY_abi_cxx11_,
               DAT_006b9090 + DBKeys::CRYPTED_KEY_abi_cxx11_);
    memcpy(local_88,vchPubKey,0x41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130,vchCryptedSecret)
    ;
    local_130.second.vch[8] = auStack_c0[8];
    local_130.second.vch[9] = auStack_c0[9];
    local_130.second.vch[10] = auStack_c0[10];
    local_130.second.vch[0xb] = auStack_c0[0xb];
    local_130.second.vch[0xc] = auStack_c0[0xc];
    local_130.second.vch[0xd] = auStack_c0[0xd];
    local_130.second.vch[0xe] = auStack_c0[0xe];
    local_130.second.vch[0xf] = auStack_c0[0xf];
    local_130.second.vch[0x10] = auStack_c0[0x10];
    local_130.second.vch[0x11] = auStack_c0[0x11];
    local_130.second.vch[0x12] = auStack_c0[0x12];
    local_130.second.vch[0x13] = auStack_c0[0x13];
    local_130.second.vch[0x14] = auStack_c0[0x14];
    local_130.second.vch[0x15] = auStack_c0[0x15];
    local_130.second.vch[0x16] = auStack_c0[0x16];
    local_130.second.vch[0x17] = auStack_c0[0x17];
    local_130.first.field_2._8_8_ = local_c8;
    local_130.second.vch[0] = auStack_c0[0];
    local_130.second.vch[1] = auStack_c0[1];
    local_130.second.vch[2] = auStack_c0[2];
    local_130.second.vch[3] = auStack_c0[3];
    local_130.second.vch[4] = auStack_c0[4];
    local_130.second.vch[5] = auStack_c0[5];
    local_130.second.vch[6] = auStack_c0[6];
    local_130.second.vch[7] = auStack_c0[7];
    bVar1 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,uint256>>
                      (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
                             *)&local_a8,
                       (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256> *)
                       &local_130,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.first._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_130.first._M_dataplus._M_p,
                      local_130.first.field_2._M_allocated_capacity -
                      (long)local_130.first._M_dataplus._M_p);
    }
    if (bVar1) {
LAB_001a7ee1:
      paVar2 = &local_130.first.field_2;
      local_130.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,DBKeys::KEY_abi_cxx11_,DAT_006b9170 + DBKeys::KEY_abi_cxx11_);
      memcpy(&local_130.second,vchPubKey,0x41);
      EraseIC<std::pair<std::__cxx11::string,CPubKey>>(this,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_130.first._M_dataplus._M_p,
                        (ulong)(local_130.first.field_2._M_allocated_capacity + 1));
      }
      bVar1 = true;
    }
    else {
      local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = DatabaseBatch::
              Read<std::pair<std::__cxx11::string,CPubKey>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((this->m_batch)._M_t.
                         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
                          *)&local_a8,&local_148);
      if (bVar1) {
        uVar4 = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (uVar4 == 0) {
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar4 < 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar3 = std::__throw_bad_alloc();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130.first._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_130.first._M_dataplus._M_p,
                                local_130.first.field_2._M_allocated_capacity -
                                (long)local_130.first._M_dataplus._M_p);
              }
              if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_p != &local_98) {
                operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar3);
              }
            }
            goto LAB_001a8187;
          }
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(uVar4);
          __n = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        }
        local_130.first.field_2._M_allocated_capacity = (size_type)(paVar2->_M_local_buf + uVar4);
        local_130.first._M_dataplus._M_p = (pointer)paVar2;
        if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          memmove(paVar2,local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        }
        local_130.first._M_string_length = (size_type)(paVar2->_M_local_buf + __n);
        local_130.first.field_2._8_8_ = local_c8;
        local_130.second.vch[0] = auStack_c0[0];
        local_130.second.vch[1] = auStack_c0[1];
        local_130.second.vch[2] = auStack_c0[2];
        local_130.second.vch[3] = auStack_c0[3];
        local_130.second.vch[4] = auStack_c0[4];
        local_130.second.vch[5] = auStack_c0[5];
        local_130.second.vch[6] = auStack_c0[6];
        local_130.second.vch[7] = auStack_c0[7];
        local_130.second.vch[8] = auStack_c0[8];
        local_130.second.vch[9] = auStack_c0[9];
        local_130.second.vch[10] = auStack_c0[10];
        local_130.second.vch[0xb] = auStack_c0[0xb];
        local_130.second.vch[0xc] = auStack_c0[0xc];
        local_130.second.vch[0xd] = auStack_c0[0xd];
        local_130.second.vch[0xe] = auStack_c0[0xe];
        local_130.second.vch[0xf] = auStack_c0[0xf];
        local_130.second.vch[0x10] = auStack_c0[0x10];
        local_130.second.vch[0x11] = auStack_c0[0x11];
        local_130.second.vch[0x12] = auStack_c0[0x12];
        local_130.second.vch[0x13] = auStack_c0[0x13];
        local_130.second.vch[0x14] = auStack_c0[0x14];
        local_130.second.vch[0x15] = auStack_c0[0x15];
        local_130.second.vch[0x16] = auStack_c0[0x16];
        local_130.second.vch[0x17] = auStack_c0[0x17];
        bVar1 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,uint256>>
                          (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
                                 *)&local_a8,
                           (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256>
                            *)&local_130,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.first._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_130.first._M_dataplus._M_p,
                          local_130.first.field_2._M_allocated_capacity -
                          (long)local_130.first._M_dataplus._M_p);
        }
        if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar1) goto LAB_001a7ee1;
      }
      else if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
LAB_001a8187:
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteCryptedKey(const CPubKey& vchPubKey,
                                const std::vector<unsigned char>& vchCryptedSecret,
                                const CKeyMetadata &keyMeta)
{
    if (!WriteKeyMetadata(keyMeta, vchPubKey, true)) {
        return false;
    }

    // Compute a checksum of the encrypted key
    uint256 checksum = Hash(vchCryptedSecret);

    const auto key = std::make_pair(DBKeys::CRYPTED_KEY, vchPubKey);
    if (!WriteIC(key, std::make_pair(vchCryptedSecret, checksum), false)) {
        // It may already exist, so try writing just the checksum
        std::vector<unsigned char> val;
        if (!m_batch->Read(key, val)) {
            return false;
        }
        if (!WriteIC(key, std::make_pair(val, checksum), true)) {
            return false;
        }
    }
    EraseIC(std::make_pair(DBKeys::KEY, vchPubKey));
    return true;
}